

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O2

Node * __thiscall RedBlackTree::deleteBST(RedBlackTree *this,Node **root,int data)

{
  Node *pNVar1;
  long lVar2;
  Node *pNVar3;
  
  while( true ) {
    while( true ) {
      pNVar1 = *root;
      if (pNVar1 == (Node *)0x0) {
        return (Node *)0x0;
      }
      lVar2 = 8;
      if ((pNVar1->value <= data) && (lVar2 = 0x10, data <= pNVar1->value)) break;
      root = (Node **)((long)&pNVar1->value + lVar2);
    }
    if (pNVar1->left == (Node *)0x0) break;
    if (pNVar1->right == (Node *)0x0) {
      return pNVar1;
    }
    root = &pNVar1->right;
    pNVar3 = findMin(this,root);
    data = pNVar3->value;
    pNVar1->value = data;
  }
  return pNVar1;
}

Assistant:

RedBlackTree::Node *RedBlackTree::deleteBST(Node *&root, int data) {
    if (root == nullptr) {
        return root;
    }

    if (data < root->value) {
        return deleteBST(root->left, data);
    }

    if (data > root->value) {
        return deleteBST(root->right, data);
    }

    if (root->left == nullptr || root->right == nullptr) {
        return root;
    }

    Node *temp = findMin(root->right);
    root->value = temp->value;
    return deleteBST(root->right, temp->value);
}